

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jglp.cpp
# Opt level: O3

void __thiscall merlin::jglp::run(jglp *this)

{
  graph *this_00;
  double *pdVar1;
  double *pdVar2;
  pointer puVar3;
  index *piVar4;
  variable VX_00;
  pointer pdVar5;
  int iVar6;
  pointer pmVar7;
  ostream *poVar8;
  pointer puVar9;
  undefined4 extraout_var;
  findex fVar10;
  long lVar11;
  pointer pfVar12;
  long lVar13;
  double *pdVar14;
  ulong uVar15;
  pointer pdVar16;
  pointer pfVar17;
  size_type __n;
  my_set<unsigned_long> *this_01;
  index *piVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  vector<merlin::factor,_std::allocator<merlin::factor>_> fin;
  ulong *local_1e8;
  flist ids;
  vector<merlin::factor,_std::allocator<merlin::factor>_> ftmp;
  vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_> vin;
  vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_> Orig;
  vector<unsigned_long,_std::allocator<unsigned_long>_> alphas;
  variable VX;
  factor F;
  vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_> New;
  vector<double,_std::allocator<double>_> Norm;
  factor F_1;
  
  gettimeofday((timeval *)&F,(__timezone_ptr_t)0x0);
  (this->super_algorithm).m_start_time =
       (double)(long)F.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start / 1000000.0 +
       (double)(long)F._vptr_factor;
  (*(this->super_graphical_model)._vptr_graphical_model[0xf])(this);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
            (&fin,&(this->m_gmo).m_factors);
  F._vptr_factor = (_func_int **)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&Norm,((long)(this->m_gmo).m_factors.
                          super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_gmo).m_factors.
                          super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555,
             (value_type_conflict2 *)&F,(allocator_type *)&F_1);
  pfVar12 = (this->m_gmo).m_factors.
            super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pfVar17 = pfVar12;
  if (pfVar12 !=
      (this->m_gmo).m_factors.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar19 = 0;
    do {
      pdVar1 = fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
               super__Vector_impl_data._M_start[uVar19].t_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar2 = fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
               super__Vector_impl_data._M_start[uVar19].t_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      dVar21 = -INFINITY;
      if (pdVar1 != pdVar2) {
        pdVar14 = pdVar1;
        dVar20 = -INFINITY;
        do {
          dVar21 = *pdVar14;
          if (*pdVar14 <= dVar20) {
            dVar21 = dVar20;
          }
          pdVar14 = pdVar14 + 1;
          dVar20 = dVar21;
        } while (pdVar14 != pdVar2);
        lVar11 = (long)pdVar2 - (long)pdVar1 >> 3;
        lVar13 = 0;
        do {
          pdVar1[lVar13] = (double)((ulong)(pdVar1[lVar13] / dVar21) & -(ulong)(dVar21 != 0.0));
          lVar13 = lVar13 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != lVar13);
      }
      dVar21 = log(dVar21);
      Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar19] = dVar21;
      this->m_logz = dVar21 + this->m_logz;
      uVar19 = uVar19 + 1;
      pfVar12 = (this->m_gmo).m_factors.
                super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar17 = (this->m_gmo).m_factors.
                super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (uVar19 < (ulong)(((long)pfVar17 - (long)pfVar12 >> 5) * -0x5555555555555555));
  }
  vin.
  super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vin.
  super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vin.
  super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pmVar7 = (this->m_gmo).m_vadj.
           super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_gmo).m_vadj.
      super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pmVar7) {
    lVar11 = 0;
    uVar19 = 0;
    do {
      std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
      push_back(&vin,(value_type *)
                     ((long)&(pmVar7->super_my_vector<unsigned_long>).
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar11));
      uVar19 = uVar19 + 1;
      pmVar7 = (this->m_gmo).m_vadj.
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x20;
    } while (uVar19 < (ulong)((long)(this->m_gmo).m_vadj.
                                    super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar7 >> 5))
    ;
    pfVar12 = (this->m_gmo).m_factors.
              super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
              super__Vector_impl_data._M_start;
    pfVar17 = (this->m_gmo).m_factors.
              super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  vector(&Orig,((long)pfVar17 - (long)pfVar12 >> 5) * -0x5555555555555555,(allocator_type *)&F);
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  vector(&New,((long)(this->m_gmo).m_factors.
                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_gmo).m_factors.
                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                     super__Vector_impl_data._M_start >> 5) * -0x5555555555555555,
         (allocator_type *)&F);
  F._vptr_factor = (_func_int **)0x0;
  if (Orig.
      super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      Orig.
      super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      my_set<unsigned_long>::operator|=
                (Orig.
                 super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)F._vptr_factor,
                 (unsigned_long *)&F);
      F._vptr_factor = (_func_int **)((long)F._vptr_factor + 1);
    } while (F._vptr_factor <
             (_func_int **)
             ((long)Orig.
                    super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)Orig.
                    super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  resize(&this->m_mini_buckets,
         (long)(this->m_gmo).m_vadj.
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->m_gmo).m_vadj.
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[JGLP] Initialize join graph ...",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  local_1e8 = (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
  if (local_1e8 !=
      (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_00 = &(this->super_graphical_model).super_graph;
    do {
      if (this->m_debug == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Eliminating variable ",0x17);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      VX.m_label = *local_1e8;
      dVar21 = (this->super_graphical_model).m_dims.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[VX.m_label];
      uVar19 = (ulong)dVar21;
      VX.m_states = (long)(dVar21 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f | uVar19;
      uVar19 = *local_1e8;
      if ((uVar19 < (ulong)((long)vin.
                                  super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)vin.
                                  super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5)) &&
         (vin.
          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar19].super_my_vector<unsigned_long>.
          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          vin.
          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar19].super_my_vector<unsigned_long>.
          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start)) {
        my_set<unsigned_long>::my_set
                  (&ids,vin.
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar19);
        VX_00.m_states = VX.m_states;
        VX_00.m_label = VX.m_label;
        partition(this,VX_00,&fin,&vin,&Norm,&Orig,&New,&ids);
        __n = (long)ids.super_my_vector<unsigned_long>.
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)ids.super_my_vector<unsigned_long>.
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
        if (1 < __n) {
          std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
                    (&ftmp,__n,(allocator_type *)&F);
          variable_set::variable_set
                    ((variable_set *)&alphas,
                     &fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [*ids.super_my_vector<unsigned_long>.
                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start].v_);
          if (8 < (ulong)((long)ids.super_my_vector<unsigned_long>.
                                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)ids.super_my_vector<unsigned_long>.
                               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start)) {
            uVar19 = 1;
            do {
              variable_set::operator&=
                        ((variable_set *)&alphas,
                         &fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                          _M_impl.super__Vector_impl_data._M_start
                          [ids.super_my_vector<unsigned_long>.
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar19]].v_);
              uVar19 = uVar19 + 1;
            } while (uVar19 < (ulong)((long)ids.super_my_vector<unsigned_long>.
                                            super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                                            .
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)ids.super_my_vector<unsigned_long>.
                                            super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                                            .
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          factor::factor(&F,(variable_set *)&alphas,0.0);
          if (ids.super_my_vector<unsigned_long>.
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              ids.super_my_vector<unsigned_long>.
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar19 = 0;
            puVar9 = ids.super_my_vector<unsigned_long>.
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          else {
            uVar15 = 0;
            do {
              factor::maxmarginal(&F_1,fin.
                                       super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                       ._M_impl.super__Vector_impl_data._M_start +
                                       ids.super_my_vector<unsigned_long>.
                                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar15],
                                  (variable_set *)&alphas);
              pdVar5 = F_1.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              for (pdVar16 = F_1.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start; pdVar16 != pdVar5;
                  pdVar16 = pdVar16 + 1) {
                dVar21 = log(*pdVar16);
                *pdVar16 = dVar21;
              }
              factor::operator=(ftmp.
                                super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                                _M_impl.super__Vector_impl_data._M_start + uVar15,&F_1);
              factor::~factor(&F_1);
              factor::binaryOpIP<merlin::factor::binOpPlus>
                        (&F,ftmp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar15);
              uVar15 = uVar15 + 1;
              uVar19 = (long)ids.super_my_vector<unsigned_long>.
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)ids.super_my_vector<unsigned_long>.
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3;
              puVar9 = ids.super_my_vector<unsigned_long>.
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
            } while (uVar15 < uVar19);
          }
          auVar22._8_4_ = (int)(uVar19 >> 0x20);
          auVar22._0_8_ = uVar19;
          auVar22._12_4_ = 0x45300000;
          if ((long)F.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)F.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            lVar11 = (long)F.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)F.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3;
            lVar13 = 0;
            do {
              F.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13] =
                   F.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar13] *
                   (1.0 / ((auVar22._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar19) - 4503599627370496.0)));
              lVar13 = lVar13 + 1;
            } while (lVar11 + (ulong)(lVar11 == 0) != lVar13);
          }
          if (ids.super_my_vector<unsigned_long>.
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish != puVar9) {
            uVar19 = 0;
            do {
              factor::binaryOp<merlin::factor::binOpMinus>
                        (&F_1,&F,ftmp.
                                 super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar19);
              pdVar5 = F_1.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              for (pdVar16 = F_1.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start; pdVar16 != pdVar5;
                  pdVar16 = pdVar16 + 1) {
                dVar21 = exp(*pdVar16);
                *pdVar16 = dVar21;
              }
              factor::binaryOpIP<merlin::factor::binOpTimes>
                        (fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                         _M_impl.super__Vector_impl_data._M_start +
                         ids.super_my_vector<unsigned_long>.
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar19],&F_1);
              factor::~factor(&F_1);
              uVar19 = uVar19 + 1;
            } while (uVar19 < (ulong)((long)ids.super_my_vector<unsigned_long>.
                                            super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                                            .
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)ids.super_my_vector<unsigned_long>.
                                            super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                                            .
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          factor::~factor(&F);
          variable_set::~variable_set((variable_set *)&alphas);
          std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&ftmp);
        }
        alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        puVar9 = ids.super_my_vector<unsigned_long>.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (ids.super_my_vector<unsigned_long>.
            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            ids.super_my_vector<unsigned_long>.
            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            ftmp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0xffffffffffffffff;
            iVar6 = (*(this->super_graphical_model)._vptr_graphical_model[2])
                              (this,fin.
                                    super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                    ._M_impl.super__Vector_impl_data._M_start + *puVar9);
            ftmp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar6);
            if (alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&alphas,
                         (iterator)
                         alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&ftmp);
            }
            else {
              *alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish =
                   (unsigned_long)
                   ftmp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                   super__Vector_impl_data._M_start;
              alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            my_set<unsigned_long>::operator|=
                      ((this->m_mini_buckets).
                       super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + *local_1e8,(unsigned_long *)&ftmp
                      );
            pfVar12 = fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            fVar10 = *puVar9;
            variable_set::variable_set((variable_set *)&F_1,&VX);
            factor::max(&F,pfVar12 + fVar10,(variable_set *)&F_1);
            factor::operator=(fin.
                              super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                              _M_impl.super__Vector_impl_data._M_start + *puVar9,&F);
            factor::~factor(&F);
            variable_set::~variable_set((variable_set *)&F_1);
            factor::binaryOpIP<merlin::factor::binOpDivide>
                      ((this->super_graphical_model).m_factors.
                       super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                       super__Vector_impl_data._M_start +
                       (long)ftmp.
                             super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                       fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                       _M_impl.super__Vector_impl_data._M_start + *puVar9);
            pdVar1 = fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl
                     .super__Vector_impl_data._M_start[*puVar9].t_.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar2 = fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl
                     .super__Vector_impl_data._M_start[*puVar9].t_.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            dVar21 = -INFINITY;
            if (pdVar1 != pdVar2) {
              pdVar14 = pdVar1;
              dVar20 = -INFINITY;
              do {
                dVar21 = *pdVar14;
                if (*pdVar14 <= dVar20) {
                  dVar21 = dVar20;
                }
                pdVar14 = pdVar14 + 1;
                dVar20 = dVar21;
              } while (pdVar14 != pdVar2);
              lVar11 = (long)pdVar2 - (long)pdVar1 >> 3;
              lVar13 = 0;
              do {
                pdVar1[lVar13] =
                     (double)((ulong)(pdVar1[lVar13] / dVar21) & -(ulong)(dVar21 != 0.0));
                lVar13 = lVar13 + 1;
              } while (lVar11 + (ulong)(lVar11 == 0) != lVar13);
            }
            dVar21 = log(dVar21);
            this->m_logz = this->m_logz + dVar21;
            fVar10 = *puVar9;
            Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_start[fVar10] =
                 dVar21 + Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[fVar10];
            if ((long)alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start != 8) {
              uVar19 = 0;
              do {
                graph::add_edge(this_00,(index)ftmp.
                                               super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                               ._M_impl.super__Vector_impl_data._M_start,
                                alphas.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar19]);
                uVar19 = uVar19 + 1;
              } while (uVar19 < ((long)alphas.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)alphas.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U);
              fVar10 = *puVar9;
            }
            lVar11 = fVar10 * 0x20;
            for (piVar18 = New.
                           super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[fVar10].
                           super_my_vector<unsigned_long>.
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
                piVar18 !=
                *(index **)
                 ((long)&((New.
                           super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_my_vector<unsigned_long>).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish + lVar11); piVar18 = piVar18 + 1) {
              graph::add_edge(this_00,*piVar18,
                              (index)ftmp.
                                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
              fVar10 = *puVar9;
              lVar11 = fVar10 << 5;
            }
            this_01 = (my_set<unsigned_long> *)
                      ((long)&((New.
                                super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_my_vector<unsigned_long>).
                              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar11);
            puVar3 = Orig.
                     super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[fVar10].
                     super_my_vector<unsigned_long>.
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (Orig.
                super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start[fVar10].super_my_vector<unsigned_long>.
                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish != puVar3) {
              Orig.
              super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start[fVar10].super_my_vector<unsigned_long>.
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = puVar3;
              piVar18 = (this_01->super_my_vector<unsigned_long>).
                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            piVar4 = (this_01->super_my_vector<unsigned_long>).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (piVar18 != piVar4) {
              (this_01->super_my_vector<unsigned_long>).
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = piVar4;
            }
            my_set<unsigned_long>::operator|=(this_01,(unsigned_long *)&ftmp);
            graphical_model::insert
                      (&this->super_graphical_model,&vin,*puVar9,
                       &fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                        _M_impl.super__Vector_impl_data._M_start[*puVar9].v_);
            puVar9 = puVar9 + 1;
          } while (puVar9 != ids.super_my_vector<unsigned_long>.
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
          if (alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (ids.super_my_vector<unsigned_long>.
            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(ids.super_my_vector<unsigned_long>.
                          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      local_1e8 = local_1e8 + 1;
    } while (local_1e8 !=
             (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (this->m_debug != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Finished creating the join graph.",0x21);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  }
  factor::factor(&F,0.0);
  if (fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar19 = 0;
    do {
      factor::factor(&F_1,fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                          _M_impl.super__Vector_impl_data._M_start + uVar19);
      pdVar5 = F_1.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar16 = F_1.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start; pdVar16 != pdVar5; pdVar16 = pdVar16 + 1) {
        dVar21 = log(*pdVar16);
        *pdVar16 = dVar21;
      }
      factor::binaryOpIP<merlin::factor::binOpPlus>(&F,&F_1);
      factor::~factor(&F_1);
      uVar19 = uVar19 + 1;
    } while (uVar19 < (ulong)(((long)fin.
                                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)fin.
                                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5) *
                             -0x5555555555555555));
  }
  if (F.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      F.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __assert_fail("F.nvar() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/src/jglp.cpp"
                  ,0x13d,"virtual void merlin::jglp::run()");
  }
  if (F.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      F.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    dVar21 = -INFINITY;
  }
  else {
    dVar21 = -INFINITY;
    do {
      dVar20 = *F.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (*F.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start <= dVar21) {
        dVar20 = dVar21;
      }
      dVar21 = dVar20;
      F.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = F.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
    } while (F.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start !=
             F.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  this->m_logz = dVar21 + this->m_logz;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[JGLP] Finished initialization in ",0x22);
  gettimeofday((timeval *)&F_1,(__timezone_ptr_t)0x0);
  poVar8 = std::ostream::_M_insert<double>
                     (((double)(long)F_1.v_.m_v.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start / 1000000.0 +
                      (double)(long)F_1._vptr_factor) - (this->super_algorithm).m_start_time);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," seconds",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[JGLP] Initial Upper Bound is ",0x1e);
  *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 6;
  poVar8 = std::ostream::_M_insert<double>(this->m_logz);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," (",2);
  lVar11 = *(long *)poVar8;
  lVar13 = *(long *)(lVar11 + -0x18);
  *(uint *)(poVar8 + lVar13 + 0x18) = *(uint *)(poVar8 + lVar13 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar8 + *(long *)(lVar11 + -0x18) + 8) = 6;
  dVar21 = exp(this->m_logz);
  poVar8 = std::ostream::_M_insert<double>(dVar21);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  tighten(this,this->m_num_iter,-1.0,-1.0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[JGLP] Final Upper Bound is ",0x1c);
  lVar11 = std::cout;
  *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(operator_delete__ + *(long *)(lVar11 + -0x18)) = 6;
  poVar8 = std::ostream::_M_insert<double>(this->m_logz);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," (",2);
  lVar11 = *(long *)poVar8;
  lVar13 = *(long *)(lVar11 + -0x18);
  *(uint *)(poVar8 + lVar13 + 0x18) = *(uint *)(poVar8 + lVar13 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar8 + *(long *)(lVar11 + -0x18) + 8) = 6;
  dVar21 = exp(this->m_logz);
  poVar8 = std::ostream::_M_insert<double>(dVar21);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  dVar21 = graphical_model::logP(&this->m_gmo,&this->m_best_config);
  this->m_lb = dVar21;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[JGLP] Final Lower Bound is ",0x1c);
  lVar11 = std::cout;
  *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(operator_delete__ + *(long *)(lVar11 + -0x18)) = 6;
  poVar8 = std::ostream::_M_insert<double>(this->m_lb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," (",2);
  lVar11 = *(long *)poVar8;
  lVar13 = *(long *)(lVar11 + -0x18);
  *(uint *)(poVar8 + lVar13 + 0x18) = *(uint *)(poVar8 + lVar13 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar8 + *(long *)(lVar11 + -0x18) + 8) = 6;
  dVar21 = exp(this->m_lb);
  poVar8 = std::ostream::_M_insert<double>(dVar21);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MAP",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  puVar9 = (this->m_best_config).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  F_1._vptr_factor = (_func_int **)&std::cout;
  F_1.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x17722a;
  lVar11 = (long)(this->m_best_config).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar9 >> 3;
  if (0 < lVar11) {
    uVar19 = lVar11 + 1;
    do {
      std::ostream_iterator<unsigned_long,_char,_std::char_traits<char>_>::operator=
                ((ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *)&F_1,puVar9);
      puVar9 = puVar9 + 1;
      uVar19 = uVar19 - 1;
    } while (1 < uVar19);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  factor::~factor(&F);
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  ~vector(&New);
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  ~vector(&Orig);
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  ~vector(&vin);
  if (Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&fin);
  return;
}

Assistant:

void jglp::run() {

	// Start the timer and store it
	m_start_time = timeSystem();

	// Initialize
	init();

	// Prepare the buckets
	std::vector<factor> fin(m_gmo.get_factors()); // get the original input factors
	std::vector<double> Norm(m_gmo.num_factors(), 0.0); // and normalize them
	for (size_t i = 0; i < m_gmo.num_factors(); ++i) {
		double mx = fin[i].max();
		fin[i] /= mx;
		Norm[i] = std::log(mx);
		m_logz += Norm[i];
	}

	// Map each variable to the list of factors mentioning that variable
	std::vector<flist> vin;
	for (size_t i = 0; i < m_gmo.nvar(); ++i) {
		vin.push_back(m_gmo.with_variable(var(i)));
	}

	// Origination info: which original factors are included for the first
	// time, and which newly created clusters feed into this cluster
	std::vector<flist> Orig(m_gmo.num_factors());
	std::vector<flist> New(m_gmo.num_factors());
	for (size_t i = 0; i < Orig.size(); ++i) {
		Orig[i] |= i;
	}

	// save the mini-buckets (as lists of factor indeces)
	m_mini_buckets.resize(m_gmo.nvar());

	// Eliminate each variable in the sequence given:
	std::cout << "[JGLP] Initialize join graph ..." << std::endl;

	for (variable_order_t::const_iterator x = m_order.begin(); x != m_order.end(); ++x) {

		if (m_debug) {
			std::cout << "  Eliminating variable " << *x << std::endl;
		}

		variable VX = var(*x);
		if (*x >= vin.size() || vin[*x].size() == 0)
			continue;  // check that we have some factors over this variable


		// list of factor IDs contained in this bucket
		flist ids = vin[*x];

		// partition into mini-buckets
		partition(VX, fin, vin, Norm, Orig, New, ids);

		// Perform any matching?
		//    "Matching" here is: compute the largest overlap of all buckets,
		//    and ensure that the
		//    moments on that subset of variables are identical in all buckets.
		if ( ids.size() > 1 ) {
			std::vector<factor> ftmp(ids.size());  // compute geometric mean
			variable_set var = fin[ids[0]].vars();      // on all mutual variables
			for (size_t i = 1; i < ids.size(); i++)
				var &= fin[ids[i]].vars();
			//Factor fmatch(var,1.0);
			factor fmatch(var, 0.0);
			for (size_t i = 0; i < ids.size(); i++) {
				//ftmp[i] = marg(fin[ids[i]],var);
				//fmatch *= ftmp[i];
				ftmp[i] = marg(fin[ids[i]], var).log();
				fmatch += ftmp[i];
			}
			//fmatch ^= (1.0/ids.size());                  // and match each bucket to it
			fmatch *= (1.0 / ids.size());     // and match each bucket to it
			//for (size_t i=0;i<ids.size();i++) fin[ids[i]] *= fmatch/ftmp[i];
			for (size_t i = 0; i < ids.size(); i++)
				fin[ids[i]] *= (fmatch - ftmp[i]).exp();
		}

		// Eliminate individually within buckets
		std::vector<findex> alphas;
		for (flistIt i = ids.begin(); i != ids.end(); ++i) {

			// Create new cluster alpha over this set of variables;
			// save function parameters also
			findex alpha = findex(-1);//, alpha2 = findex(-1);
			alpha = add_factor(fin[*i]);
			alphas.push_back(alpha);
			m_mini_buckets[*x] |= alpha;

			fin[*i] = elim(fin[*i], VX);

			m_factors[alpha] /= fin[*i];

			// normalize for numerical stability
			double maxf = fin[*i].max();
			fin[*i] /= maxf;
			maxf = std::log(maxf);
			m_logz += maxf;
			Norm[*i] += maxf; // save normalization for overall bound

			for (size_t j = 0; j < alphas.size() - 1; ++j)
				add_edge(alpha, alphas[j]);
			for (flistIt j = New[*i].begin(); j != New[*i].end(); ++j)
				add_edge(*j, alpha);

			Orig[*i].clear();
			New[*i].clear();
			New[*i] |= alpha;  // now incoming nodes to *i is just alpha

			insert(vin, *i, fin[*i].vars()); // recompute and update adjacency
		}
	}
	/// end for: variable elim order

	if (m_debug) {
		std::cout << "Finished creating the join graph." << std::endl;
	}

	// Compute the initial upper bound
	factor F(0.0);
	for (size_t i = 0; i < fin.size(); ++i)
		F += log(fin[i]);
	assert(F.nvar() == 0);
	m_logz += F.max();

	std::cout << "[JGLP] Finished initialization in " << (timeSystem() - m_start_time) << " seconds" << std::endl;
	std::cout << "[JGLP] Initial Upper Bound is "
		<< std::setprecision(MERLIN_PRECISION)
		<< m_logz << " (" << std::scientific
		<< std::setprecision(MERLIN_PRECISION)
		<< std::exp(m_logz)	<< ")" << std::endl;

	// Followed by iterative cost-shifting tighteing via JG propagation
	tighten(m_num_iter);

	// Output the MAP assignment
	std::cout << "[JGLP] Final Upper Bound is "
		<< std::fixed << std::setprecision(MERLIN_PRECISION)
		<< m_logz << " (" << std::scientific
		<< std::setprecision(MERLIN_PRECISION)
		<< std::exp(m_logz)	<< ")" << std::endl;

	m_lb = m_gmo.logP(m_best_config);
	std::cout << "[JGLP] Final Lower Bound is "
		<< std::fixed << std::setprecision(MERLIN_PRECISION)
		<< m_lb << " (" << std::scientific
		<< std::setprecision(MERLIN_PRECISION)
		<< std::exp(m_lb) << ")" << std::endl;

	std::cout << "MAP" << std::endl;
	std::cout << m_best_config.size() << " ";
	std::copy(m_best_config.begin(), m_best_config.end(),
			std::ostream_iterator<index>(std::cout, " "));
	std::cout << std::endl;
}